

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_types.h
# Opt level: O0

Quat * cp::rpy2q(Quat *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_108 [32];
  AngleAxis<double> local_e8;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_c8 [32];
  AngleAxis<double> local_a8;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_88 [32];
  AngleAxis<double> local_68;
  QuaternionType local_48;
  double local_28;
  double yaw_local;
  double pitch_local;
  double roll_local;
  Quat *q;
  
  local_28 = yaw;
  yaw_local = pitch;
  pitch_local = roll;
  roll_local = (double)__return_storage_ptr__;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_68,&pitch_local,local_88);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_a8,&yaw_local,local_c8);
  Eigen::AngleAxis<double>::operator*(&local_48,&local_68,&local_a8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_e8,&local_28,local_108);
  Eigen::operator*(__return_storage_ptr__,&local_48,&local_e8);
  return __return_storage_ptr__;
}

Assistant:

inline Quat rpy2q(double roll, double pitch, double yaw) {
  Quat q = AngleAxisd(roll, Vector3::UnitX())
           * AngleAxisd(pitch, Vector3::UnitY())
           * AngleAxisd(yaw,   Vector3::UnitZ());
  return q;
}